

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::ProcessNewScObject(BackwardPass *this,Instr *instr)

{
  int value;
  int symID;
  int value_00;
  int value_01;
  int value_02;
  Func *this_00;
  long lVar1;
  code *pcVar2;
  AddPropertyCacheBucket *pAVar3;
  bool bVar4;
  BOOLEAN BVar5;
  BailOutKind BVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  RegOpnd *pRVar9;
  StackSym *this_01;
  ProfiledInstr *pPVar10;
  ObjTypeGuardBucket *this_02;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  ObjTypeGuardBucket *local_d8;
  bool local_b9;
  ObjTypeGuardBucket *bucket_1;
  BVSparse<Memory::JitArenaAllocator> *guardedPropertyOps;
  ObjTypeGuardBucket *bucket;
  JITTypeHolder local_88;
  Type local_80;
  nullptr_t local_78;
  Type local_70;
  JITTypeHolderBase<void> local_68;
  JITTypeHolderBase<void> local_60;
  JITTypeHolderBase<void> local_58;
  JITTypeHolderBase<void> local_50;
  nullptr_t local_48;
  JITTypeHolderBase<void> local_40;
  AddPropertyCacheBucket *local_38;
  AddPropertyCacheBucket *pBucket;
  JITTimeConstructorCache *ctorCache;
  StackSym *objSym;
  BasicBlock *block;
  Instr *instr_local;
  BackwardPass *this_local;
  
  if ((((this->tag == DeadStorePhase) &&
       (block = (BasicBlock *)instr, instr_local = (Instr *)this, bVar4 = IsCollectionPass(this),
       !bVar4)) && (bVar4 = IR::Instr::IsNewScObjectInstr((Instr *)block), bVar4)) &&
     ((bVar4 = IR::Instr::HasBailOutInfo((Instr *)block), bVar4 &&
      (BVar6 = IR::Instr::GetBailOutKindNoBits((Instr *)block), BVar6 == BailOutFailedCtorGuardCheck
      )))) {
    bVar4 = IR::Instr::IsProfiledInstr((Instr *)block);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x131d,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pOVar8 = IR::Instr::GetDst((Instr *)block);
    bVar4 = IR::Opnd::IsRegOpnd(pOVar8);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x131e,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    objSym = (StackSym *)this->currentBlock;
    pOVar8 = IR::Instr::GetDst((Instr *)block);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
    ctorCache = (JITTimeConstructorCache *)IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((BVSparse<Memory::JitArenaAllocator> *)(objSym->field_5).m_instrDef,
                       (((StackSym *)ctorCache)->super_Sym).m_id);
    if (BVar5 == '\0') {
      IR::Instr::ClearBailOutInfo((Instr *)block);
      if ((BasicBlock *)this->preOpBailOutInstrToProcess == block) {
        this->preOpBailOutInstrToProcess = (Instr *)0x0;
      }
      if (objSym[1].field_5.m_instrDef == (Instr *)0x0) {
        local_d8 = (ObjTypeGuardBucket *)0x0;
      }
      else {
        value_02._0_1_ = (ctorCache->m_data).type.exists;
        value_02._1_1_ = (ctorCache->m_data).type.flags;
        value_02._2_1_ = (ctorCache->m_data).type.isShared;
        value_02._3_1_ = (ctorCache->m_data).type.struct_pad_0;
        local_d8 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                             ((HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)
                              objSym[1].field_5.m_instrDef,value_02);
      }
      if (local_d8 != (ObjTypeGuardBucket *)0x0) {
        pBVar11 = ObjTypeGuardBucket::GetGuardedPropertyOps(local_d8);
        bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar11);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1369,
                             "(bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty())",
                             "bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty()");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
    }
    else {
      pOVar8 = IR::Instr::GetDst((Instr *)block);
      pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
      this_01 = IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
      bVar4 = StackSym::HasObjectTypeSym(this_01);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1327,
                           "(instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym())",
                           "instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym()");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      this_00 = (Func *)block->liveFixedFields;
      pPVar10 = IR::Instr::AsProfiledInstr((Instr *)block);
      pBucket = (AddPropertyCacheBucket *)
                Func::GetConstructorCache(this_00,(pPVar10->u).field_3.fldInfoData.f1);
      lVar1._0_4_ = objSym[1].m_offset;
      lVar1._4_4_ = objSym[1].m_argPosition;
      if (lVar1 != 0) {
        value._0_1_ = (ctorCache->m_data).type.exists;
        value._1_1_ = (ctorCache->m_data).type.flags;
        value._2_1_ = (ctorCache->m_data).type.isShared;
        value._3_1_ = (ctorCache->m_data).type.struct_pad_0;
        local_38 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Get
                             (*(HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> **)
                               &objSym[1].m_offset,value);
        local_b9 = false;
        if (local_38 != (AddPropertyCacheBucket *)0x0) {
          local_40.t = (Type)AddPropertyCacheBucket::GetInitialType(local_38);
          local_48 = (nullptr_t)0x0;
          bVar4 = JITTypeHolderBase<void>::operator!=(&local_40,&local_48);
          local_b9 = false;
          if (bVar4) {
            local_50.t = (Type)AddPropertyCacheBucket::GetFinalType(local_38);
            local_58.t = (Type)AddPropertyCacheBucket::GetInitialType(local_38);
            local_b9 = JITTypeHolderBase<void>::operator!=(&local_50,&local_58);
          }
        }
        if (local_b9 != false) {
          local_60.t = (Type)AddPropertyCacheBucket::GetInitialType(local_38);
          local_68.t = (Type)JITTimeConstructorCache::GetType((JITTimeConstructorCache *)pBucket);
          bVar4 = JITTypeHolderBase<void>::operator==(&local_60,&local_68);
          if (((bVar4 ^ 0xffU) & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1334,"(pBucket->GetInitialType() == ctorCache->GetType())",
                               "pBucket->GetInitialType() == ctorCache->GetType()");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          bVar4 = IsPrePass(this);
          if (!bVar4) {
            InsertTypeTransition
                      (this,(Instr *)block->loop,(StackSym *)ctorCache,local_38,
                       (BVSparse<Memory::JitArenaAllocator> *)(objSym->field_5).m_instrDef);
          }
          local_70 = (Type)AddPropertyCacheBucket::GetInitialType(local_38);
          (local_38->deadStoreUnavailableInitialType).t = local_70;
          local_78 = (nullptr_t)0x0;
          bVar4 = JITTypeHolderBase<void>::operator==
                            (&local_38->deadStoreUnavailableFinalType,&local_78);
          if (bVar4) {
            local_80 = (Type)AddPropertyCacheBucket::GetFinalType(local_38);
            (local_38->deadStoreUnavailableFinalType).t = local_80;
          }
          pAVar3 = local_38;
          JITTypeHolderBase<void>::JITTypeHolderBase(&local_88,(JITType *)0x0);
          AddPropertyCacheBucket::SetInitialType(pAVar3,local_88);
          pAVar3 = local_38;
          JITTypeHolderBase<void>::JITTypeHolderBase
                    ((JITTypeHolderBase<void> *)&bucket,(JITType *)0x0);
          AddPropertyCacheBucket::SetFinalType(pAVar3,(JITTypeHolder)bucket);
          symID._0_1_ = (ctorCache->m_data).type.exists;
          symID._1_1_ = (ctorCache->m_data).type.flags;
          symID._2_1_ = (ctorCache->m_data).type.isShared;
          symID._3_1_ = (ctorCache->m_data).type.struct_pad_0;
          ClearTypeIDWithFinalType(this,symID,(BasicBlock *)objSym);
        }
      }
      if (((objSym[1].field_5.m_instrDef != (Instr *)0x0) &&
          (value_00._0_1_ = (ctorCache->m_data).type.exists,
          value_00._1_1_ = (ctorCache->m_data).type.flags,
          value_00._2_1_ = (ctorCache->m_data).type.isShared,
          value_00._3_1_ = (ctorCache->m_data).type.struct_pad_0,
          this_02 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                              ((HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)
                               objSym[1].field_5.m_instrDef,value_00),
          this_02 != (ObjTypeGuardBucket *)0x0)) &&
         (pBVar11 = ObjTypeGuardBucket::GetGuardedPropertyOps(this_02),
         pBVar11 != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
        JITTimeConstructorCache::EnsureGuardedPropOps
                  ((JITTimeConstructorCache *)pBucket,this->func->m_alloc);
        JITTimeConstructorCache::AddGuardedPropOps((JITTimeConstructorCache *)pBucket,pBVar11);
        ObjTypeGuardBucket::SetGuardedPropertyOps
                  (this_02,(BVSparse<Memory::JitArenaAllocator> *)0x0);
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  (this->tempAlloc,pBVar11);
        value_01._0_1_ = (ctorCache->m_data).type.exists;
        value_01._1_1_ = (ctorCache->m_data).type.flags;
        value_01._2_1_ = (ctorCache->m_data).type.isShared;
        value_01._3_1_ = (ctorCache->m_data).type.struct_pad_0;
        HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
                  ((HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)
                   objSym[1].field_5.m_instrDef,value_01);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessNewScObject(IR::Instr* instr)
{
    if (this->tag != Js::DeadStorePhase || IsCollectionPass())
    {
        return;
    }

    if (!instr->IsNewScObjectInstr())
    {
        return;
    }

    // The instruction could have a lazy bailout associated with it, which might get cleared
    // later, so we make sure that we only process instructions with the right bailout kind.
    if (instr->HasBailOutInfo() && instr->GetBailOutKindNoBits() == IR::BailOutFailedCtorGuardCheck)
    {
        Assert(instr->IsProfiledInstr());
        Assert(instr->GetDst()->IsRegOpnd());

        BasicBlock * block = this->currentBlock;
        StackSym* objSym = instr->GetDst()->AsRegOpnd()->GetStackSym();

        if (block->upwardExposedUses->Test(objSym->m_id))
        {
            // If the object created here is used downstream, let's capture any property operations we must protect.

            Assert(instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym());

            JITTimeConstructorCache* ctorCache = instr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId));

            if (block->stackSymToFinalType != nullptr)
            {
                // NewScObject is the origin of the object pointer. If we have a final type in hand, do the
                // transition here.
                AddPropertyCacheBucket *pBucket = block->stackSymToFinalType->Get(objSym->m_id);
                if (pBucket &&
                    pBucket->GetInitialType() != nullptr &&
                    pBucket->GetFinalType() != pBucket->GetInitialType())
                {
                    Assert(pBucket->GetInitialType() == ctorCache->GetType());
                    if (!this->IsPrePass())
                    {
                        this->InsertTypeTransition(instr->m_next, objSym, pBucket, block->upwardExposedUses);
                    }
#if DBG
                    pBucket->deadStoreUnavailableInitialType = pBucket->GetInitialType();
                    if (pBucket->deadStoreUnavailableFinalType == nullptr)
                    {
                        pBucket->deadStoreUnavailableFinalType = pBucket->GetFinalType();
                    }
                    pBucket->SetInitialType(nullptr);
                    pBucket->SetFinalType(nullptr);
#else
                    block->stackSymToFinalType->Clear(objSym->m_id);
#endif
                    this->ClearTypeIDWithFinalType(objSym->m_id, block);
                }
            }

            if (block->stackSymToGuardedProperties != nullptr)
            {
                ObjTypeGuardBucket* bucket = block->stackSymToGuardedProperties->Get(objSym->m_id);
                if (bucket != nullptr)
                {
                    BVSparse<JitArenaAllocator>* guardedPropertyOps = bucket->GetGuardedPropertyOps();
                    if (guardedPropertyOps != nullptr)
                    {
                        ctorCache->EnsureGuardedPropOps(this->func->m_alloc);
                        ctorCache->AddGuardedPropOps(guardedPropertyOps);

                        bucket->SetGuardedPropertyOps(nullptr);
                        JitAdelete(this->tempAlloc, guardedPropertyOps);
                        block->stackSymToGuardedProperties->Clear(objSym->m_id);
                    }
                }
            }
        }
        else
        {
            // If the object is not used downstream, let's remove the bailout and let the lowerer emit a fast path along with
            // the fallback on helper, if the ctor cache ever became invalid.
            instr->ClearBailOutInfo();
            if (preOpBailOutInstrToProcess == instr)
            {
                preOpBailOutInstrToProcess = nullptr;
            }

#if DBG
            // We're creating a brand new object here, so no type check upstream could protect any properties of this
            // object. Let's make sure we don't have any left to protect.
            ObjTypeGuardBucket* bucket = block->stackSymToGuardedProperties != nullptr ?
                block->stackSymToGuardedProperties->Get(objSym->m_id) : nullptr;
            Assert(bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty());
#endif
        }
    }
}